

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall
GdlGlyphDefn::CheckExistenceOfGlyphAttr
          (GdlGlyphDefn *this,GdlObject *pgdlAvsOrExp,GrcSymbolTable *param_2,
          GrcGlyphAttrMatrix *pgax,Symbol psymGlyphAttr)

{
  ushort wGlyphID;
  int nAttrID;
  size_t __n;
  bool bVar1;
  int iVar2;
  pointer puVar3;
  gid16 wGlyphID_00;
  ulong uVar4;
  bool bVar5;
  string local_d8;
  string local_b8;
  GdlObject *local_98;
  string local_90;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  nAttrID = psymGlyphAttr->m_nInternalID;
  local_98 = pgdlAvsOrExp;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"gpoint","");
  __n = (psymGlyphAttr->m_staFieldName)._M_string_length;
  if (__n == local_48) {
    if (__n == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp((psymGlyphAttr->m_staFieldName)._M_dataplus._M_p,local_50,__n);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  puVar3 = (this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    uVar4 = 0;
    do {
      wGlyphID = puVar3[uVar4];
      if ((GdlGlyphDefn *)(ulong)wGlyphID != (GdlGlyphDefn *)0xfffb) {
        if (bVar5) {
          bVar1 = GrcGlyphAttrMatrix::GpointDefined(pgax,wGlyphID,nAttrID,0);
          if (bVar1) {
            if (bVar5) goto LAB_0013190e;
            goto LAB_00131784;
          }
        }
        else {
LAB_00131784:
          if ((pgax->m_cStyles != 0 && (pgax->m_cGlyphIDs != 0 && pgax->m_cGlyphAttrs != 0)) &&
             (pgax->m_prgasgnx
              [(int)((int)pgax->m_cStyles * ((int)pgax->m_cGlyphAttrs * (uint)wGlyphID + nAttrID))].
              m_pexp != (GdlExpression *)0x0)) goto LAB_0013190e;
        }
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Glyph attribute \'","")
        ;
        GrcSymbolTableEntry::FullName_abi_cxx11_(&local_90,psymGlyphAttr);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"\' is not defined for glyph ","");
        GlyphIDString_abi_cxx11_(&local_70,(GdlGlyphDefn *)(ulong)wGlyphID,wGlyphID_00);
        GrcErrorList::AddItem
                  (&g_errorList,true,0x102a,local_98,(GrpLineAndFile *)0x0,&local_b8,&local_90,
                   &local_d8,&local_70,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0013190e:
      uVar4 = uVar4 + 1;
      puVar3 = (this->m_vwGlyphIDs).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->m_vwGlyphIDs).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 1));
  }
  return;
}

Assistant:

void GdlGlyphDefn::CheckExistenceOfGlyphAttr(GdlObject * pgdlAvsOrExp,
	GrcSymbolTable * /*psymtbl*/, GrcGlyphAttrMatrix * pgax, Symbol psymGlyphAttr)
{
	int nGlyphAttrID = psymGlyphAttr->InternalID();
	bool fGpoint = psymGlyphAttr->LastFieldIs("gpoint");

	for (size_t iw = 0; iw < m_vwGlyphIDs.size(); iw++)
	{
		if (m_vwGlyphIDs[iw] == kBadGlyph)
			continue;

		gid16 wGlyphID = m_vwGlyphIDs[iw];
		if ((fGpoint && !pgax->GpointDefined(wGlyphID, nGlyphAttrID)) ||
			(!fGpoint && !pgax->Defined(wGlyphID, nGlyphAttrID)))
		{
			g_errorList.AddError(4138, pgdlAvsOrExp,
				"Glyph attribute '",
				psymGlyphAttr->FullName(),
				"' is not defined for glyph ",
				GlyphIDString(wGlyphID));
		}
	}
}